

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O2

char * __thiscall llvm::DWARFDie::getName(DWARFDie *this,DINameKind Kind)

{
  char *pcVar1;
  ArrayRef<llvm::dwarf::Attribute> Attrs;
  ArrayRef<llvm::dwarf::Attribute> Attrs_00;
  Optional<llvm::DWARFFormValue> local_58;
  Attribute local_1c [2];
  
  pcVar1 = (char *)0x0;
  if (((Kind != None) && (this->U != (DWARFUnit *)0x0)) && (this->Die != (DWARFDebugInfoEntry *)0x0)
     ) {
    if (Kind == LinkageName) {
      local_1c[0] = DW_AT_MIPS_linkage_name;
      local_1c[1] = DW_AT_linkage_name;
      Attrs.Length = 2;
      Attrs.Data = local_1c;
      findRecursively(&local_58,this,Attrs);
      pcVar1 = dwarf::toString(&local_58,(char *)0x0);
      if (pcVar1 != (char *)0x0) {
        return pcVar1;
      }
    }
    local_1c[0] = 3;
    Attrs_00.Length = 1;
    Attrs_00.Data = local_1c;
    findRecursively(&local_58,this,Attrs_00);
    pcVar1 = dwarf::toString(&local_58,(char *)0x0);
  }
  return pcVar1;
}

Assistant:

const char *DWARFDie::getName(DINameKind Kind) const {
  if (!isValid() || Kind == DINameKind::None)
    return nullptr;
  // Try to get mangled name only if it was asked for.
  if (Kind == DINameKind::LinkageName) {
    if (auto Name = dwarf::toString(
            findRecursively({DW_AT_MIPS_linkage_name, DW_AT_linkage_name}),
            nullptr))
      return Name;
  }
  if (auto Name = dwarf::toString(findRecursively(DW_AT_name), nullptr))
    return Name;
  return nullptr;
}